

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
glcts::LayoutBindingBaseCase::updateTemplate(LayoutBindingBaseCase *this,eStageType stage)

{
  mapped_type *ppcVar1;
  mapped_type *params;
  mapped_type *this_00;
  allocator<char> local_75;
  eStageType local_74;
  StringTemplate local_70;
  string local_50;
  string local_30;
  
  local_74 = stage;
  ppcVar1 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,&local_74);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar1,&local_75);
  tcu::StringTemplate::StringTemplate(&local_70,&local_50);
  params = std::
           map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator[](&this->m_templateParams,&local_74);
  tcu::StringTemplate::specialize(&local_30,&local_70,params);
  this_00 = std::
            map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_sources,&local_74);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  tcu::StringTemplate::~StringTemplate(&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void updateTemplate(eStageType stage)
	{
		m_sources[stage] = tcu::StringTemplate(m_templates[stage]).specialize(m_templateParams[stage]);
	}